

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  Mem *pMVar4;
  u8 uVar5;
  char cVar6;
  int nName;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  uint N;
  long lVar12;
  uchar *puVar13;
  long in_FS_OFFSET;
  int idx;
  int local_c4;
  MemValue local_a8;
  undefined1 *puStack_a0;
  undefined8 uStack_98;
  sqlite3 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  StrAccum local_68;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_a8.i = -1;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  psVar3 = p->db;
  local_68.mxAlloc = psVar3->aLimit[0];
  local_68.nAlloc = 0;
  local_68.db = (sqlite3 *)0x0;
  local_68.zText = (char *)0x0;
  local_68.nChar = 0;
  local_68.accError = '\0';
  local_68.printfFlags = '\0';
  local_68._30_2_ = 0xaaaa;
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      if (zRawSql == (char *)0x0) {
        N = 0;
      }
      else {
        sVar10 = strlen(zRawSql);
        N = (uint)sVar10 & 0x3fffffff;
      }
LAB_00127018:
      sqlite3_str_append(&local_68,zRawSql,N);
    }
    else if (*zRawSql != '\0') {
      local_c4 = 1;
      do {
        local_3c = -0x55555556;
        N = 0;
        puVar13 = (uchar *)zRawSql;
        while (nName = sqlite3GetToken(puVar13,&local_3c), local_3c != 0x9d) {
          N = N + nName;
          puVar1 = puVar13 + nName;
          puVar13 = puVar13 + nName;
          if (*puVar1 == '\0') goto LAB_00127018;
        }
        sqlite3_str_append(&local_68,zRawSql,N);
        if (nName == 0) break;
        puVar13 = (uchar *)zRawSql + (int)N;
        if (*puVar13 == '?') {
          if (nName < 2) {
            local_40 = local_c4;
          }
          else {
            sqlite3GetInt32((char *)(puVar13 + 1),&local_40);
          }
        }
        else {
          local_40 = sqlite3VListNameToNum(p->pVList,(char *)puVar13,nName);
        }
        if (local_c4 < local_40 + 1) {
          local_c4 = local_40 + 1;
        }
        pMVar4 = p->aVar;
        lVar9 = (long)local_40;
        uVar2 = pMVar4[lVar9 + -1].flags;
        if ((uVar2 & 1) == 0) {
          if ((uVar2 & 0x24) == 0) {
            if ((uVar2 & 8) == 0) {
              if ((uVar2 & 2) == 0) {
                if ((uVar2 >> 10 & 1) == 0) {
                  uVar8 = local_68._24_8_ & 0xffffffff;
                  if (local_68.nChar + 2 < local_68.nAlloc) {
                    local_68.nChar = local_68.nChar + 2;
                    (local_68.zText + uVar8)[0] = 'x';
                    (local_68.zText + uVar8)[1] = '\'';
                  }
                  else {
                    enlargeAndAppend(&local_68,"x\'",2);
                  }
                  iVar7 = pMVar4[lVar9 + -1].n;
                  if (0 < (long)iVar7) {
                    lVar12 = 0;
                    do {
                      sqlite3_str_appendf(&local_68,"%02x",(ulong)(byte)pMVar4[lVar9 + -1].z[lVar12]
                                         );
                      lVar12 = lVar12 + 1;
                    } while (iVar7 != lVar12);
                  }
                  uVar8 = local_68._24_8_ & 0xffffffff;
                  if (local_68.nAlloc <= local_68.nChar + 1) {
                    pcVar11 = "\'";
                    iVar7 = 1;
                    goto LAB_00126df1;
                  }
                  local_68.nChar = local_68.nChar + 1;
                  local_68.zText[uVar8] = '\'';
                }
                else {
                  sqlite3_str_appendf(&local_68,"zeroblob(%d)",
                                      (ulong)(uint)pMVar4[lVar9 + -1].u.nZero);
                }
              }
              else if (psVar3->enc == '\x01') {
                sqlite3_str_appendf(&local_68,"\'%.*q\'",(ulong)(uint)pMVar4[lVar9 + -1].n,
                                    pMVar4[lVar9 + -1].z);
              }
              else {
                uStack_98 = (undefined1 *)0x0;
                puStack_88 = (undefined1 *)0x0;
                local_80 = (undefined1 *)0x0;
                local_a8.r = 0.0;
                puStack_a0 = (undefined1 *)0x0;
                puStack_78 = (undefined1 *)0x0;
                local_90 = psVar3;
                sqlite3VdbeMemSetStr
                          ((Mem *)&local_a8,pMVar4[lVar9 + -1].z,(long)pMVar4[lVar9 + -1].n,
                           psVar3->enc,(_func_void_void_ptr *)0x0);
                if (((ulong)uStack_98 & 0x200000000) == 0) {
                  uStack_98._0_7_ = CONCAT16(1,(undefined6)uStack_98);
                }
                else if ((uStack_98._6_1_ != '\x01') &&
                        (iVar7 = sqlite3VdbeMemTranslate((Mem *)&local_a8,'\x01'), iVar7 == 7)) {
                  local_68.accError = '\a';
                  local_68.nAlloc = 0;
                }
                sqlite3_str_appendf(&local_68,"\'%.*q\'",(ulong)uStack_98 & 0xffffffff,puStack_a0);
                if ((((ulong)uStack_98 & 0x900000000000) != 0) || ((int)puStack_88 != 0)) {
                  vdbeMemClear((Mem *)&local_a8);
                }
              }
            }
            else {
              sqlite3_str_appendf(&local_68,"%!.15g",pMVar4[lVar9 + -1].u.nZero);
            }
          }
          else {
            sqlite3_str_appendf(&local_68,"%lld",pMVar4[lVar9 + -1].u.r);
          }
        }
        else {
          uVar8 = local_68._24_8_ & 0xffffffff;
          if (local_68.nChar + 4 < local_68.nAlloc) {
            local_68.nChar = local_68.nChar + 4;
            builtin_strncpy(local_68.zText + uVar8,"NULL",4);
          }
          else {
            pcVar11 = "NULL";
            iVar7 = 4;
LAB_00126df1:
            enlargeAndAppend(&local_68,pcVar11,iVar7);
          }
        }
        zRawSql = (char *)(puVar13 + nName);
      } while (*zRawSql != '\0');
    }
  }
  else {
    cVar6 = *zRawSql;
    if (cVar6 != '\0') {
      do {
        lVar9 = 1;
        do {
          lVar12 = lVar9;
          if (cVar6 == '\n') break;
          cVar6 = zRawSql[lVar12];
          lVar9 = lVar12 + 1;
        } while (cVar6 != '\0');
        uVar8 = local_68._24_8_ & 0xffffffff;
        if (local_68.nChar + 3 < local_68.nAlloc) {
          local_68.nChar = local_68.nChar + 3;
          local_68.zText[uVar8 + 2] = ' ';
          (local_68.zText + uVar8)[0] = '-';
          (local_68.zText + uVar8)[1] = '-';
        }
        else {
          enlargeAndAppend(&local_68,"-- ",3);
        }
        sqlite3_str_append(&local_68,zRawSql,(int)lVar12);
        cVar6 = zRawSql[lVar12];
        zRawSql = zRawSql + lVar12;
      } while (cVar6 != '\0');
    }
  }
  if (local_68.accError != '\0') {
    uVar5 = local_68.printfFlags;
    if ((local_68._24_8_ & 0x40000000000) != 0) {
      if (local_68.zText != (char *)0x0) {
        sqlite3DbFreeNN(local_68.db,local_68.zText);
      }
      local_68._24_8_ =
           CONCAT26(local_68._30_2_,CONCAT15(uVar5,local_68._24_5_)) & 0xfffffbffffffffff;
    }
    local_68.nAlloc = 0;
    local_68._24_8_ = local_68._24_8_ & 0xffffffff00000000;
    local_68.zText = (char *)0x0;
  }
  pcVar11 = sqlite3StrAccumFinish(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pcVar11;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}